

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::HierarchicalInstanceSyntax::HierarchicalInstanceSyntax
          (HierarchicalInstanceSyntax *this,InstanceNameSyntax *decl,Token openParen,
          SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *connections,Token closeParen)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  PortConnectionSyntax *pPVar4;
  undefined8 uVar5;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *__range2;
  iterator_base<slang::syntax::PortConnectionSyntax_*> local_30;
  
  uVar5 = openParen._0_8_;
  (this->super_SyntaxNode).kind = HierarchicalInstance;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  this->decl = decl;
  (this->openParen).kind = (short)uVar5;
  (this->openParen).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openParen).info = openParen.info;
  uVar3 = *(undefined4 *)&(connections->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (connections->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->connections).super_SyntaxListBase.super_SyntaxNode.kind =
       (connections->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->connections).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->connections).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->connections).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (connections->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->connections).super_SyntaxListBase.childCount =
       (connections->super_SyntaxListBase).childCount;
  (this->connections).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005a3830;
  sVar1 = (connections->elements)._M_extent._M_extent_value;
  (this->connections).elements._M_ptr = (connections->elements)._M_ptr;
  (this->connections).elements._M_extent._M_extent_value = sVar1;
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  (this->closeParen).info = closeParen.info;
  if (decl != (InstanceNameSyntax *)0x0) {
    (decl->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  (this->connections).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  local_30.index = 0;
  sVar1 = (this->connections).elements._M_extent._M_extent_value;
  local_30.list = &this->connections;
  for (; (local_30.list != &this->connections || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pPVar4 = SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::
             iterator_base<slang::syntax::PortConnectionSyntax_*>::dereference(&local_30);
    (pPVar4->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  return;
}

Assistant:

HierarchicalInstanceSyntax(InstanceNameSyntax* decl, Token openParen, const SeparatedSyntaxList<PortConnectionSyntax>& connections, Token closeParen) :
        SyntaxNode(SyntaxKind::HierarchicalInstance), decl(decl), openParen(openParen), connections(connections), closeParen(closeParen) {
        if (this->decl) this->decl->parent = this;
        this->connections.parent = this;
        for (auto child : this->connections)
            child->parent = this;
    }